

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SFormat.cpp
# Opt level: O3

void __thiscall
slang::ast::SFormat::TypeVisitor::formatArray<slang::SVQueue>
          (TypeVisitor *this,Type *type,SVQueue *arr)

{
  FormatBuffer *this_00;
  _Map_pointer ppCVar1;
  Type *this_01;
  reference args;
  size_t i;
  ulong __n;
  
  this_01 = Type::getArrayElementType(type);
  this_00 = &this->buffer;
  ::fmt::v11::detail::buffer<char>::append<char>((buffer<char> *)this_00,"\'{","");
  for (__n = 0; ppCVar1 = (arr->
                          super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
                          super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_node,
      __n < ((long)(arr->super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
                   super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
                   _M_impl.super__Deque_impl_data._M_start._M_last -
             (long)(arr->super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
                   super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
                   _M_impl.super__Deque_impl_data._M_start._M_cur >> 3) * -0x3333333333333333 +
            ((long)(arr->super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
                   super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
                   _M_impl.super__Deque_impl_data._M_finish._M_cur -
             (long)(arr->super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
                   super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
                   _M_impl.super__Deque_impl_data._M_finish._M_first >> 3) * -0x3333333333333333 +
            (((long)ppCVar1 -
              (long)(arr->super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
                    super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
            (ulong)(ppCVar1 == (_Map_pointer)0x0)) * 0xc; __n = __n + 1) {
    if (__n != 0) {
      ::fmt::v11::detail::buffer<char>::append<char>((buffer<char> *)this_00,",","");
      if (this->abbreviated == false) {
        ::fmt::v11::detail::buffer<char>::append<char>((buffer<char> *)this_00," ","");
      }
    }
    args = std::
           _Deque_iterator<slang::ConstantValue,_slang::ConstantValue_&,_slang::ConstantValue_*>::
           operator[](&(arr->
                       super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
                       super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                       ._M_impl.super__Deque_impl_data._M_start,__n);
    Symbol::visit<slang::ast::SFormat::TypeVisitor&,slang::ConstantValue_const&>
              (&this_01->super_Symbol,this,args);
  }
  ::fmt::v11::detail::buffer<char>::append<char>((buffer<char> *)this_00,"}","");
  return;
}

Assistant:

void formatArray(const Type& type, const T& arr) {
        auto elemType = type.getArrayElementType();
        SLANG_ASSERT(elemType);

        buffer.append("'{");
        for (size_t i = 0; i < arr.size(); i++) {
            if (i != 0) {
                buffer.append(",");
                if (!abbreviated)
                    buffer.append(" ");
            }
            elemType->visit(*this, arr[i]);
        }
        buffer.append("}");
    }